

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

Library * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Library>
          (Structure *this,shared_ptr<Assimp::Blender::Library> *out,size_t *s)

{
  Library *this_00;
  element_type *peVar1;
  shared_ptr<Assimp::Blender::Library> local_30;
  size_t *local_20;
  size_t *s_local;
  shared_ptr<Assimp::Blender::Library> *out_local;
  Structure *this_local;
  
  local_20 = s;
  s_local = (size_t *)out;
  out_local = (shared_ptr<Assimp::Blender::Library> *)this;
  this_00 = (Library *)operator_new(0x618);
  memset(this_00,0,0x618);
  Library::Library(this_00);
  ::std::shared_ptr<Assimp::Blender::Library>::shared_ptr<Assimp::Blender::Library,void>
            (&local_30,this_00);
  ::std::shared_ptr<Assimp::Blender::Library>::operator=
            ((shared_ptr<Assimp::Blender::Library> *)s_local,&local_30);
  ::std::shared_ptr<Assimp::Blender::Library>::~shared_ptr(&local_30);
  *local_20 = 1;
  peVar1 = ::std::__shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2> *)s_local)
  ;
  return peVar1;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }